

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::len(Parser *this)

{
  ExprNode *this_00;
  ExprNode *this_01;
  undefined8 extraout_RAX;
  Token closeParen;
  Token openParen;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  Token local_168;
  Token local_f8;
  Token local_88;
  
  Tokenizer::getToken(&local_88,this->tokenizer);
  if (local_88._symbol == '(') {
    this_00 = variableID(this);
    Tokenizer::getToken(&local_168,this->tokenizer);
    if (local_168._symbol == ')') {
      this_01 = (ExprNode *)operator_new(0x80);
      ExprNode::token(&local_f8,this_00);
      LengthExpr::LengthExpr((LengthExpr *)this_01,&local_f8);
      Token::~Token(&local_f8);
      Token::~Token(&local_168);
      Token::~Token(&local_88);
      return this_01;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Parser::sub",(allocator<char> *)&local_168);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Expected an ( sign, instead got",&local_1ea);
    die(this,&local_188,&local_1a8,&local_88);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"Parser::sub",&local_1ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Expected an ) sign, instead got",&local_1e9);
  die(this,&local_1c8,&local_1e8,&local_168);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  Token::~Token(&local_168);
  Token::~Token(&local_88);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ExprNode *Parser::len() {
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::sub", "Expected an ( sign, instead got", openParen);
    ExprNode *id = variableID();
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::sub", "Expected an ) sign, instead got", closeParen);
    return new LengthExpr(id->token());
}